

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

int __thiscall asl::File::open(File *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  String *pSVar5;
  ulong uVar6;
  char *__filename;
  char fopen_mode [8];
  
  bVar1 = String::operator==((String *)__file,"");
  if (bVar1) {
    iVar2 = 0;
  }
  else {
    uVar3 = __oflag & 3;
    if (uVar3 == 2) {
      fopen_mode[0] = 'a';
    }
    else if (uVar3 == 1) {
      fopen_mode[0] = 'w';
    }
    else {
      fopen_mode[0] = 'r';
    }
    fopen_mode[1] = 't';
    if ((__oflag & 8U) == 0) {
      fopen_mode[1] = 'b';
    }
    if (uVar3 == 3) {
      fopen_mode[2] = '+';
      uVar3 = 3;
    }
    else {
      uVar3 = 2;
    }
    if ((__oflag & 4U) != 0) {
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      fopen_mode[uVar6] = 'x';
    }
    fopen_mode[uVar3] = '\0';
    if (*(int *)__file == 0) {
      __filename = __file + 8;
    }
    else {
      __filename = *(char **)(__file + 8);
    }
    pFVar4 = fopen(__filename,fopen_mode);
    this->_file = (FILE *)pFVar4;
    pSVar5 = String::operator=(&this->_path,(String *)__file);
    iVar2 = (int)CONCAT71((int7)((ulong)pSVar5 >> 8),this->_file != (FILE *)0x0);
  }
  return iVar2;
}

Assistant:

bool File::open(const String& name, File::OpenMode mode)
{
	if(name == "")
		return false;
	CHART fopen_mode[8];
	int   i = 0;
	switch (mode & (READ | WRITE | APPEND | RW))
	{
	case WRITE:
		fopen_mode[i++] = STR_PREFIX('w');
		break;
	case APPEND:
		fopen_mode[i++] = STR_PREFIX('a');
		break;
	default:
		fopen_mode[i++] = STR_PREFIX('r');
		break;
	}

	fopen_mode[i++] = (mode & TEXT) ? STR_PREFIX('t') : STR_PREFIX('b');

	if ((mode & (READ | WRITE | APPEND | RW)) == RW)
		fopen_mode[i++] = STR_PREFIX('+');

#if !defined _MSC_VER || _MSC_VER >= 1900
	if (mode & CREATE)
		fopen_mode[i++] = STR_PREFIX('x');
#endif

	fopen_mode[i] = 0;

	_file = fopenX(name, fopen_mode);

	_path = name;

	return _file != 0;
}